

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void getPU(double *A,int M,int N,int *ipiv,double *P,double *U)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  size_t sVar16;
  
  uVar11 = (ulong)(uint)N;
  uVar13 = (ulong)(uint)M;
  lVar6 = (long)M;
  __ptr = malloc(lVar6 * 4);
  if (0 < M) {
    uVar3 = 0;
    do {
      *(int *)((long)__ptr + (long)ipiv[uVar3] * 4) = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar13 != uVar3);
  }
  iVar4 = N;
  if (M < N) {
    iVar4 = M;
  }
  lVar15 = (long)iVar4;
  __ptr_00 = malloc(lVar6 * lVar15 * 8);
  iVar4 = M - N;
  if (iVar4 == 0) {
    if (__ptr_00 != (void *)0x0 && 0 < M) {
      uVar5 = M - 2;
      sVar16 = 0;
      uVar1 = 1;
      lVar7 = 1;
      uVar10 = 0;
      pvVar14 = __ptr_00;
      do {
        uVar11 = (ulong)uVar10;
        if (sVar16 != 0) {
          memcpy((void *)((long)__ptr_00 + uVar11 * 8),A + uVar11,sVar16);
        }
        *(undefined8 *)((long)pvVar14 + uVar11 * 8) = 0x3ff0000000000000;
        if (lVar7 < lVar6) {
          memset((void *)((long)__ptr_00 + (ulong)uVar1 * 8),0,(ulong)uVar5 * 8 + 8);
        }
        pvVar14 = (void *)((long)pvVar14 + 8);
        uVar10 = uVar10 + M;
        uVar5 = uVar5 - 1;
        uVar1 = uVar1 + M + 1;
        sVar16 = sVar16 + 8;
        lVar7 = lVar7 + 1;
      } while (uVar13 << 3 != sVar16);
    }
    if (U != (double *)0x0 && 0 < M) {
      uVar3 = 0;
      pdVar9 = U;
      uVar11 = uVar13;
      do {
        if (uVar3 != 0) {
          memset(U + (uint)((int)uVar3 * M),0,uVar3 * 8);
        }
        uVar2 = 0;
        do {
          pdVar9[uVar2] = A[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar11 != uVar2);
        uVar3 = uVar3 + 1;
        pdVar9 = pdVar9 + uVar13 + 1;
        A = A + uVar13 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar3 != uVar13);
    }
  }
  else if (iVar4 == 0 || M < N) {
    if (M < N) {
      if (__ptr_00 != (void *)0x0 && 0 < M) {
        uVar1 = M - 2;
        uVar3 = 1;
        sVar16 = 0;
        lVar7 = 1;
        uVar5 = 0;
        iVar4 = 0;
        do {
          if (sVar16 != 0) {
            memcpy((void *)((long)__ptr_00 + (ulong)uVar5 * 8),A + iVar4,sVar16);
          }
          *(undefined8 *)((long)__ptr_00 + (ulong)((int)uVar3 - 1) * 8) = 0x3ff0000000000000;
          if (lVar7 < lVar6) {
            memset((void *)((long)__ptr_00 + uVar3 * 8),0,(ulong)uVar1 * 8 + 8);
          }
          uVar1 = uVar1 - 1;
          uVar3 = (ulong)(uint)((int)uVar3 + M + 1);
          iVar4 = iVar4 + N;
          uVar5 = uVar5 + M;
          sVar16 = sVar16 + 8;
          lVar7 = lVar7 + 1;
        } while (uVar13 * 8 != sVar16);
      }
      if (U != (double *)0x0 && 0 < M) {
        lVar6 = (long)N;
        uVar3 = 0;
        pdVar9 = U;
        do {
          if (uVar3 != 0) {
            memset(U + (int)uVar3 * N,0,uVar3 * 8);
          }
          if ((long)uVar3 < lVar6) {
            uVar2 = 0;
            do {
              pdVar9[uVar2] = A[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar11 != uVar2);
          }
          uVar3 = uVar3 + 1;
          A = A + lVar6 + 1;
          pdVar9 = pdVar9 + lVar6 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar3 != uVar13);
      }
    }
  }
  else {
    if (__ptr_00 != (void *)0x0) {
      if (N < 1) {
        uVar3 = (ulong)N;
      }
      else {
        uVar3 = (ulong)(uint)N;
        sVar16 = 0;
        uVar1 = 1;
        uVar8 = 1;
        uVar5 = 0;
        uVar2 = uVar3;
        pvVar14 = __ptr_00;
        do {
          uVar12 = (ulong)uVar5;
          if (sVar16 != 0) {
            memcpy((void *)((long)__ptr_00 + uVar12 * 8),A + uVar12,sVar16);
          }
          *(undefined8 *)((long)pvVar14 + uVar12 * 8) = 0x3ff0000000000000;
          if (uVar8 < uVar3) {
            memset((void *)((long)__ptr_00 + (ulong)uVar1 * 8),0,(ulong)((int)uVar2 - 2) * 8 + 8);
          }
          pvVar14 = (void *)((long)pvVar14 + 8);
          uVar5 = uVar5 + N;
          uVar1 = uVar1 + N + 1;
          sVar16 = sVar16 + 8;
          uVar8 = uVar8 + 1;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      memcpy((void *)((long)__ptr_00 + (ulong)(uint)(N * N) * 8),A + (uint)(N * N),
             (long)iVar4 * uVar3 * 8);
    }
    if (0 < N && U != (double *)0x0) {
      uVar2 = 0;
      pdVar9 = U;
      uVar3 = uVar11;
      do {
        if (uVar2 != 0) {
          memset(U + (uint)((int)uVar2 * N),0,uVar2 * 8);
        }
        uVar8 = 0;
        do {
          pdVar9[uVar8] = A[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
        uVar2 = uVar2 + 1;
        pdVar9 = pdVar9 + uVar11 + 1;
        A = A + uVar11 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar2 != uVar11);
    }
  }
  if (0 < M) {
    uVar11 = 0;
    do {
      memcpy(P,(void *)((long)__ptr_00 + *(int *)((long)__ptr + uVar11 * 4) * lVar15 * 8),lVar15 * 8
            );
      uVar11 = uVar11 + 1;
      P = P + lVar15;
    } while (uVar13 != uVar11);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void getPU(double *A, int M, int N, int *ipiv, double *P,double *U) {
	int i,j,K;
	int *ipivt;
	double *L;

	ipivt = (int*)malloc(sizeof(int)*M);

	for (i = 0; i < M; ++i) {
		ipivt[ipiv[i]] = i;
	}

	if (M > N) {
		K = N;
	}
	else {
		K = M;
	}

	L = (double*)malloc(sizeof(double)*M*K);

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}

	for (i = 0; i < M; ++i) {
		memcpy(P + i*K, L + ipivt[i] * K, sizeof(double)*K);
	}


	free(ipivt);
	free(L);
}